

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_merge.c
# Opt level: O2

int linkedlist_merge(s_linkedlist *linked_list_to,s_linkedlist *linked_list_to_from)

{
  int iVar1;
  s_linkedlist *linked_list;
  
  linked_list = linkedlist_create();
  if (linked_list != (s_linkedlist *)0x0) {
    do {
      linked_list_to_from = (s_linkedlist *)((s_linkedlist_node *)linked_list_to_from)->next;
      if ((s_linkedlist_node *)linked_list_to_from == (s_linkedlist_node *)0x0) {
        linked_list_to->tail->next = linked_list->head;
        linked_list_to->size = linked_list_to->size + linked_list->size;
        free(linked_list);
        return 0;
      }
      iVar1 = linkedlist_add_back(linked_list,((s_linkedlist_node *)linked_list_to_from)->element);
    } while (iVar1 != -1);
    linkedlist_destroy(linked_list,(_func_void_void_ptr *)0x0);
  }
  return -1;
}

Assistant:

int linkedlist_merge(s_linkedlist *linked_list_to, s_linkedlist *linked_list_to_from) {
    s_linkedlist      *linked_list_tmp      = linkedlist_create();
    s_linkedlist_node *linked_list_node_tmp = linked_list_to_from->head;

    if (linked_list_tmp == NULL) {
        return (LINKEDLIST_RETVAL_FAILURE);
    }

    while (linked_list_node_tmp != NULL) {
        if (linkedlist_add_back(linked_list_tmp, linked_list_node_tmp->element) == LINKEDLIST_RETVAL_FAILURE) {
            linkedlist_destroy(linked_list_tmp, NULL);

            return (LINKEDLIST_RETVAL_FAILURE);
        }

        linked_list_node_tmp = linked_list_node_tmp->next;
    }

    linked_list_to->tail->next = linked_list_tmp->head;
    linked_list_to->size += linked_list_tmp->size;
    free(linked_list_tmp);

    return (LINKEDLIST_RETVAL_SUCCESS);
}